

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
::dealloc(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
          *this)

{
  size_t sVar1;
  void *p;
  
  sVar1 = capacity(this);
  if (sVar1 != 0) {
    slot_array(this);
    capacity(this);
    infoz(this);
    p = CommonFields::backing_array_start((CommonFields *)this);
    sVar1 = CommonFields::alloc_size((CommonFields *)this,8,8);
    Deallocate<8ul,std::allocator<google::protobuf::compiler::SCC_const*>>
              ((allocator<const_google::protobuf::compiler::SCC_*> *)this,p,sVar1);
    return;
  }
  __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe4f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<const google::protobuf::compiler::SCC *>>::dealloc() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<const google::protobuf::compiler::SCC *>]"
               );
}

Assistant:

inline void dealloc() {
    ABSL_SWISSTABLE_ASSERT(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }